

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filetree.c
# Opt level: O0

void filetree_get_file_size(gpointer user,gpointer user_data)

{
  __dev_t *p_Var1;
  int iVar2;
  undefined8 uVar3;
  guint64 *file_size;
  filename_list_node *fln;
  GStatBuf stat_buf;
  gpointer user_data_local;
  gpointer user_local;
  
  stat_buf.__glibc_reserved[2] = (__syscall_slong_t)user_data;
  uVar3 = g_malloc(8);
  *(undefined8 *)((long)user + 8) = uVar3;
  p_Var1 = *(__dev_t **)((long)user + 8);
  iVar2 = stat((char *)**user,(stat *)&fln);
  if (iVar2 == 0) {
    *p_Var1 = stat_buf.st_rdev;
  }
  else {
    *p_Var1 = 0;
  }
  return;
}

Assistant:

void filetree_get_file_size(gpointer user, gpointer user_data)
{
#if GLIB_CHECK_VERSION(2, 25, 0)
    GStatBuf stat_buf;
#else
    struct stat stat_buf;
#endif
    struct filename_list_node *fln = (struct filename_list_node *) user;
    guint64 *file_size;

    (void) user_data;
    fln->d = g_malloc(sizeof(guint64));
    file_size = (guint64 *) fln->d;
    if (g_stat(fln->fr->raw, &stat_buf)) {
        *file_size = 0;
    } else {
        *file_size = (guint64) stat_buf.st_size;
    }
}